

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bind.cpp
# Opt level: O0

void __thiscall lambda_bind_mem_fn_Test::TestBody(lambda_bind_mem_fn_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  offset_in_Thing_to_subr in_RDX;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Thing thing;
  int *in_stack_fffffffffffffd08;
  anon_class_32_4_621f8b79 *in_stack_fffffffffffffd10;
  Thing **in_stack_fffffffffffffd18;
  anon_class_40_5_21af6246 *__return_storage_ptr__;
  anon_class_24_2_f9fac9d9 *in_stack_fffffffffffffd20;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd2c;
  int line;
  char *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  Type TVar2;
  anon_class_32_4_621f8b79 *__return_storage_ptr___00;
  AssertHelper *in_stack_fffffffffffffd40;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  undefined1 uVar3;
  AssertHelper *in_stack_fffffffffffffd90;
  int local_22c [3];
  Thing *local_220;
  anon_class_40_5_21af6246 local_218;
  int local_1ec;
  AssertionResult local_1e8 [2];
  undefined4 local_1c8;
  undefined4 local_1c4;
  code *local_1c0;
  undefined8 local_1b8;
  int local_1b0 [2];
  Thing *local_1a8;
  anon_class_32_4_621f8b79 local_1a0;
  int local_17c;
  AssertionResult local_178 [2];
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  code *local_148;
  undefined8 local_140;
  int local_134;
  Thing *local_130;
  anon_class_32_3_853befe6 local_128;
  int local_104;
  AssertionResult local_100 [2];
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  code *local_d0;
  undefined8 local_c8;
  Thing *local_c0;
  anon_class_24_2_f9fac9d9 local_b8;
  int local_9c;
  AssertionResult local_98;
  uint local_84;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  Thing *local_50;
  code *local_48;
  undefined8 local_40;
  anon_class_16_1_3fcf6586 *local_38;
  int local_24;
  AssertionResult local_20;
  Thing local_9 [9];
  
  TVar2 = (Type)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  local_48 = Thing::fn;
  local_40 = 0;
  local_38 = lambda::bind<int(Thing::*)(int,int,int)>
                       ((anon_class_16_1_3fcf6586 *)Thing::fn,(lambda *)0x0,in_RDX);
  local_50 = local_9;
  local_54 = 1;
  local_58 = 2;
  local_5c = 3;
  local_24 = lambda::bind<int(Thing::*)(int,int,int)>(int(Thing::*)(int,int,int))::
             {lambda((auto:1&&)...)#1}::operator()
                       ((anon_class_16_1_3fcf6586 *)in_stack_fffffffffffffd20,
                        in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10,
                        in_stack_fffffffffffffd08,(int *)0x17a7ad);
  local_60 = 6;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
             (char *)in_stack_fffffffffffffd20,(int *)in_stack_fffffffffffffd18,
             (int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd40);
    in_stack_fffffffffffffd90 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x17a84f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd40,TVar2,in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
               (char *)in_stack_fffffffffffffd20);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd90,
               (Message *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
    testing::Message::~Message((Message *)0x17a8b2);
  }
  local_84 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17a920);
  if (local_84 == 0) {
    local_c0 = local_9;
    local_d0 = Thing::fn;
    local_c8 = 0;
    lambda::bind<int(Thing::*)(int,int,int),Thing*>(&local_b8,(lambda *)Thing::fn,0,&local_c0);
    local_d4 = 1;
    local_d8 = 2;
    local_dc = 3;
    local_9c = lambda::bind<int(Thing::*)(int,int,int),Thing*>(int(Thing::*)(int,int,int),Thing*&&)
               ::{lambda((auto:1&&)...)#1}::operator()
                         (in_stack_fffffffffffffd20,(int *)in_stack_fffffffffffffd18,
                          (int *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    local_e0 = 6;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
               (char *)in_stack_fffffffffffffd20,(int *)in_stack_fffffffffffffd18,
               (int *)in_stack_fffffffffffffd10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
    uVar3 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd40);
      testing::AssertionResult::failure_message((AssertionResult *)0x17aa78);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd40,TVar2,in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c
                 ,(char *)in_stack_fffffffffffffd20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd90,(Message *)CONCAT17(uVar3,in_stack_fffffffffffffd88));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
      testing::Message::~Message((Message *)0x17aad5);
    }
    local_84 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x17ab43);
    if (local_84 == 0) {
      local_130 = local_9;
      local_134 = 1;
      local_148 = Thing::fn;
      local_140 = 0;
      lambda::bind<int(Thing::*)(int,int,int),Thing*,int>
                (&local_128,(lambda *)Thing::fn,0,&local_130,&local_134);
      local_14c = 2;
      local_150 = 3;
      local_104 = lambda::
                  bind<int(Thing::*)(int,int,int),Thing*,int>(int(Thing::*)(int,int,int),Thing*&&,int&&)
                  ::{lambda((auto:1&&)...)#1}::operator()
                            ((anon_class_32_3_853befe6 *)in_stack_fffffffffffffd10,
                             in_stack_fffffffffffffd08,(int *)0x17abed);
      local_154 = 6;
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                 (char *)in_stack_fffffffffffffd20,(int *)in_stack_fffffffffffffd18,
                 (int *)in_stack_fffffffffffffd10);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffd40);
        testing::AssertionResult::failure_message((AssertionResult *)0x17ac95);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffd40,TVar2,in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd2c,(char *)in_stack_fffffffffffffd20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffd90,(Message *)CONCAT17(uVar3,in_stack_fffffffffffffd88));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
        testing::Message::~Message((Message *)0x17acf2);
      }
      local_84 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x17ad60);
      if (local_84 == 0) {
        local_1a8 = local_9;
        local_1b0[1] = 1;
        local_1b0[0] = 2;
        local_1c0 = Thing::fn;
        local_1b8 = 0;
        __return_storage_ptr___00 = &local_1a0;
        lambda::bind<int(Thing::*)(int,int,int),Thing*,int,int>
                  (__return_storage_ptr___00,(lambda *)Thing::fn,0,&local_1a8,local_1b0 + 1,
                   local_1b0);
        TVar2 = (Type)((ulong)__return_storage_ptr___00 >> 0x20);
        local_1c4 = 3;
        local_17c = lambda::
                    bind<int(Thing::*)(int,int,int),Thing*,int,int>(int(Thing::*)(int,int,int),Thing*&&,int&&,int&&)
                    ::{lambda((auto:1&&)...)#1}::operator()
                              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        local_1c8 = 6;
        this_02 = local_178;
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (char *)in_stack_fffffffffffffd20,(int *)in_stack_fffffffffffffd18,
                   (int *)in_stack_fffffffffffffd10);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
        if (!bVar1) {
          testing::Message::Message((Message *)this_02);
          in_stack_fffffffffffffd30 =
               testing::AssertionResult::failure_message((AssertionResult *)0x17aeb2);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_02,TVar2,in_stack_fffffffffffffd30,
                     in_stack_fffffffffffffd2c,(char *)in_stack_fffffffffffffd20);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffd90,(Message *)CONCAT17(uVar3,in_stack_fffffffffffffd88))
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd10);
          testing::Message::~Message((Message *)0x17af0f);
        }
        local_84 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x17af7d);
        if (local_84 == 0) {
          local_220 = local_9;
          local_22c[2] = 1;
          local_22c[1] = 2;
          local_22c[0] = 3;
          __return_storage_ptr__ = &local_218;
          lambda::bind<int(Thing::*)(int,int,int),Thing*,int,int,int>
                    (__return_storage_ptr__,(lambda *)Thing::fn,0,&local_220,local_22c + 2,
                     local_22c + 1,local_22c);
          local_1ec = anon_class_40_5_21af6246::operator()<>((anon_class_40_5_21af6246 *)0x17b02d);
          this_01 = local_1e8;
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     &this_01->success_,(int *)__return_storage_ptr__,
                     (int *)in_stack_fffffffffffffd10);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
          line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd2c);
          if (!bVar1) {
            testing::Message::Message((Message *)this_02);
            this_00 = (AssertHelper *)
                      testing::AssertionResult::failure_message((AssertionResult *)0x17b0d5);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)this_02,TVar2,in_stack_fffffffffffffd30,line,
                       &this_01->success_);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffd90,
                       (Message *)CONCAT17(uVar3,in_stack_fffffffffffffd88));
            testing::internal::AssertHelper::~AssertHelper(this_00);
            testing::Message::~Message((Message *)0x17b132);
          }
          local_84 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x17b19d);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(lambda, bind_mem_fn) {
    Thing thing;
    ASSERT_EQ(lmd::bind(&Thing::fn)(&thing, 1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing)(1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing, 1)(2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing, 1, 2)(3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing, 1, 2, 3)(), 6);
}